

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1e8ba::CpuTest_lsr_a_sets_c_and_z_flags_Test::
~CpuTest_lsr_a_sets_c_and_z_flags_Test(CpuTest_lsr_a_sets_c_and_z_flags_Test *this)

{
  CpuTest_lsr_a_sets_c_and_z_flags_Test *this_local;
  
  ~CpuTest_lsr_a_sets_c_and_z_flags_Test(this);
  operator_delete(this,0x118);
  return;
}

Assistant:

TEST_F(CpuTest, lsr_a_sets_c_and_z_flags) {
    stage_instruction(LSR_ACC);
    registers.a = 0b00000001;
    expected.a = 0b00000000;
    expected.p = C_FLAG | Z_FLAG;

    step_execution(2);
    EXPECT_EQ(expected, registers);
}